

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::session_impl::on_udp_writeable
          (session_impl *this,weak_ptr<libtorrent::aux::session_udp_socket> *sock,error_code *ec)

{
  pointer psVar1;
  pointer psVar2;
  long lVar3;
  long lVar4;
  shared_ptr<libtorrent::aux::session_udp_socket> s;
  __shared_ptr<libtorrent::aux::session_udp_socket,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  if (ec->failed_ != false) {
    return;
  }
  ::std::__shared_ptr<libtorrent::aux::session_udp_socket,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_20);
  if (local_20._M_ptr == (element_type *)0x0) goto LAB_0028fbec;
  (local_20._M_ptr)->write_blocked = false;
  psVar2 = (this->m_listen_sockets).
           super__Vector_base<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->m_listen_sockets).
           super__Vector_base<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar3 = (long)psVar1 - (long)psVar2;
  for (lVar4 = lVar3 >> 6; 0 < lVar4; lVar4 = lVar4 + -1) {
    if ((((psVar2->super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>)
         ._M_ptr)->udp_sock).
        super___shared_ptr<libtorrent::aux::session_udp_socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        == local_20._M_ptr) goto LAB_0028fbc6;
    if (((psVar2[1].super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr)->udp_sock).
        super___shared_ptr<libtorrent::aux::session_udp_socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        == local_20._M_ptr) {
      psVar2 = psVar2 + 1;
      goto LAB_0028fbc6;
    }
    if (((psVar2[2].super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr)->udp_sock).
        super___shared_ptr<libtorrent::aux::session_udp_socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        == local_20._M_ptr) {
      psVar2 = psVar2 + 2;
      goto LAB_0028fbc6;
    }
    if (((psVar2[3].super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr)->udp_sock).
        super___shared_ptr<libtorrent::aux::session_udp_socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        == local_20._M_ptr) {
      psVar2 = psVar2 + 3;
      goto LAB_0028fbc6;
    }
    psVar2 = psVar2 + 4;
    lVar3 = lVar3 + -0x40;
  }
  lVar3 = lVar3 >> 4;
  if (lVar3 == 1) {
LAB_0028fba6:
    if ((((psVar2->super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>)
         ._M_ptr)->udp_sock).
        super___shared_ptr<libtorrent::aux::session_udp_socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        != local_20._M_ptr) {
      psVar2 = psVar1;
    }
LAB_0028fbc6:
    if ((psVar2 == psVar1) ||
       (lVar3 = 0x1bf0,
       ((psVar2->super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>).
       _M_ptr)->ssl != ssl)) goto LAB_0028fbdc;
  }
  else {
    if (lVar3 == 2) {
LAB_0028fb96:
      if ((((psVar2->
            super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
           )->udp_sock).
          super___shared_ptr<libtorrent::aux::session_udp_socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          != local_20._M_ptr) {
        psVar2 = psVar2 + 1;
        goto LAB_0028fba6;
      }
      goto LAB_0028fbc6;
    }
    if (lVar3 == 3) {
      if ((((psVar2->
            super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
           )->udp_sock).
          super___shared_ptr<libtorrent::aux::session_udp_socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          != local_20._M_ptr) {
        psVar2 = psVar2 + 1;
        goto LAB_0028fb96;
      }
      goto LAB_0028fbc6;
    }
LAB_0028fbdc:
    lVar3 = 0x1a78;
  }
  aux::utp_socket_manager::writable
            ((utp_socket_manager *)
             ((long)&(this->super_session_interface).super_session_logger._vptr_session_logger +
             lVar3));
LAB_0028fbec:
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  return;
}

Assistant:

void session_impl::on_udp_writeable(std::weak_ptr<session_udp_socket> sock, error_code const& ec)
	{
		COMPLETE_ASYNC("session_impl::on_udp_writeable");
		if (ec) return;

		auto s = sock.lock();
		if (!s) return;

		s->write_blocked = false;

#ifdef TORRENT_SSL_PEERS
		auto i = std::find_if(
			m_listen_sockets.begin(), m_listen_sockets.end()
			, [&s] (std::shared_ptr<listen_socket_t> const& ls) { return ls->udp_sock == s; });
#endif

		// notify the utp socket manager it can start sending on the socket again
		struct utp_socket_manager& mgr =
#ifdef TORRENT_SSL_PEERS
			(i != m_listen_sockets.end() && (*i)->ssl == transport::ssl) ? m_ssl_utp_socket_manager :
#endif
			m_utp_socket_manager;

		mgr.writable();
	}